

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<double>::Swap
          (RepeatedField<double> *this,RepeatedField<double> *other)

{
  Rep *pRVar1;
  Arena *pAVar2;
  Arena *arena;
  RepeatedField<double> temp;
  RepeatedField<double> RStack_28;
  
  if (this == other) {
    return;
  }
  if (this->rep_ == (Rep *)0x0) {
    pRVar1 = other->rep_;
    if (pRVar1 == (Rep *)0x0) goto LAB_003195f3;
    pAVar2 = (Arena *)0x0;
  }
  else {
    pAVar2 = this->rep_->arena;
    pRVar1 = other->rep_;
    if (pRVar1 == (Rep *)0x0) {
      if (pAVar2 == (Arena *)0x0) goto LAB_003195f3;
      arena = (Arena *)0x0;
      goto LAB_003195b5;
    }
  }
  arena = pRVar1->arena;
  if (pAVar2 == arena) {
LAB_003195f3:
    InternalSwap(this,other);
    return;
  }
LAB_003195b5:
  RepeatedField(&RStack_28,arena);
  MergeFrom(&RStack_28,this);
  CopyFrom(this,other);
  UnsafeArenaSwap(other,&RStack_28);
  ~RepeatedField(&RStack_28);
  return;
}

Assistant:

void RepeatedField<Element>::Swap(RepeatedField* other) {
  if (this == other) return;
  if (GetArenaNoVirtual() == other->GetArenaNoVirtual()) {
    InternalSwap(other);
  } else {
    RepeatedField<Element> temp(other->GetArenaNoVirtual());
    temp.MergeFrom(*this);
    CopyFrom(*other);
    other->UnsafeArenaSwap(&temp);
  }
}